

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O2

uint8_t phosg::fgetcx(FILE *f)

{
  io_error *this;
  int iVar1;
  int fd;
  allocator<char> local_41;
  string local_40;
  
  iVar1 = fgetc((FILE *)f);
  if (iVar1 != -1) {
    return (uint8_t)iVar1;
  }
  iVar1 = feof((FILE *)f);
  this = (io_error *)__cxa_allocate_exception(0x20);
  fd = fileno((FILE *)f);
  if (iVar1 == 0) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"cannot read from stream",&local_41);
    io_error::io_error(this,fd,&local_40);
    __cxa_throw(this,&io_error::typeinfo,io_error::~io_error);
  }
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"end of stream",&local_41);
  io_error::io_error(this,fd,&local_40);
  __cxa_throw(this,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

uint8_t fgetcx(FILE* f) {
  int ret = ::fgetc(f);
  if (ret == EOF) {
    if (feof(f)) {
      throw io_error(fileno(f), "end of stream");
    } else {
      throw io_error(fileno(f), "cannot read from stream");
    }
  }
  return ret;
}